

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O3

void test_mu_deadline(testing t)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  char *msg;
  int iVar4;
  uint uVar5;
  nsync_time b;
  nsync_time b_00;
  nsync_time nVar6;
  nsync_time nVar7;
  nsync_time nVar8;
  nsync_mu mu;
  nsync_mu local_40;
  
  nsync::nsync_mu_init(&local_40);
  b = nsync::nsync_time_ms(1);
  b_00 = nsync::nsync_time_ms(100);
  nsync::nsync_mu_lock(&local_40);
  iVar4 = 0x32;
  uVar5 = 0;
  do {
    nVar6 = nsync::nsync_time_now();
    nVar7 = nsync::nsync_time_ms(0x57);
    nVar6 = nsync::nsync_time_add(nVar6,nVar7);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = t;
    iVar2 = nsync::nsync_mu_wait_with_deadline
                      ((nsync *)&local_40,(nsync_mu *)false_condition,(_func_int_void_ptr *)0x0,
                       (void *)0x0,(_func_int_void_ptr_void_ptr *)nVar6.tv_sec,
                       (nsync_time)(auVar1 << 0x40),(nsync_note)nVar6.tv_nsec);
    if (iVar2 != 0x6e) {
      pcVar3 = smprintf("nsync_mu_wait() returned non-expired for a timeout");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/mu_wait_test.c"
                     ,0xec,pcVar3);
    }
    nVar7 = nsync::nsync_time_now();
    nVar8 = nsync::nsync_time_sub(nVar6,b);
    iVar2 = nsync::nsync_time_cmp(nVar7,nVar8);
    if (iVar2 < 0) {
      nVar8 = nsync::nsync_time_sub(nVar6,nVar7);
      pcVar3 = nsync_time_str(nVar8,2);
      msg = smprintf("nsync_mu_wait() returned %s too early",pcVar3);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/mu_wait_test.c"
                     ,0xf1,msg);
      free(pcVar3);
    }
    nVar6 = nsync::nsync_time_add(nVar6,b_00);
    iVar2 = nsync::nsync_time_cmp(nVar6,nVar7);
    uVar5 = uVar5 - (iVar2 >> 0x1f);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  nsync::nsync_mu_unlock(&local_40);
  if (0x19 < (int)uVar5) {
    pcVar3 = smprintf("nsync_mu_wait() returned too late %d (> %d) times",(ulong)uVar5,0x19);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/mu_wait_test.c"
                   ,0xfb,pcVar3);
  }
  return;
}

Assistant:

static void test_mu_deadline (testing t) {
	int i;
	int too_late_violations;
	nsync_mu mu;
	nsync_time too_early;
	nsync_time too_late;

	nsync_mu_init (&mu);
	too_early = nsync_time_ms (TOO_EARLY_MS);
	too_late = nsync_time_ms (TOO_LATE_MS);
	too_late_violations = 0;
	nsync_mu_lock (&mu);;
	for (i = 0; i != 50; i++) {
		nsync_time end_time;
		nsync_time start_time;
		nsync_time expected_end_time;
		start_time = nsync_time_now ();
		expected_end_time = nsync_time_add (start_time, nsync_time_ms (87));
		if (nsync_mu_wait_with_deadline (&mu, &false_condition, NULL, NULL,
						 expected_end_time, NULL) != ETIMEDOUT) {
			TEST_FATAL (t, ("nsync_mu_wait() returned non-expired for a timeout"));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, nsync_time_sub (expected_end_time, too_early)) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_mu_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (expected_end_time, too_late),  end_time) < 0) {
			too_late_violations++;
		}
	}
	nsync_mu_unlock (&mu);
	if (too_late_violations > TOO_LATE_ALLOWED) {
		TEST_ERROR (t, ("nsync_mu_wait() returned too late %d (> %d) times",
			   too_late_violations, TOO_LATE_ALLOWED));
	}
}